

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSet.cpp
# Opt level: O0

void __thiscall Js::JavascriptSet::PromoteToSimpleVarSet(JavascriptSet *this)

{
  code *pcVar1;
  bool bVar2;
  BVIndex BVar3;
  undefined4 *puVar4;
  BVSparse<Memory::Recycler> *this_00;
  BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *ptr;
  SimpleVarDataSet *newSet;
  JavascriptSet *this_local;
  
  if (this->kind != IntSet) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSet.cpp"
                                ,0x121,"(this->kind == SetKind::IntSet)",
                                "this->kind == SetKind::IntSet");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this_00 = Memory::WriteBarrierPtr<BVSparse<Memory::Recycler>_>::operator->
                      ((WriteBarrierPtr<BVSparse<Memory::Recycler>_> *)&(this->u).simpleVarSet);
  BVar3 = BVSparse<Memory::Recycler>::Count(this_00);
  ptr = CreateVarSetFromList<JsUtil::BaseDictionary<void*,Js::MapOrSetDataNode<void*>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>>
                  (this,BVar3 + 1);
  this->kind = SimpleVarSet;
  Memory::
  WriteBarrierPtr<JsUtil::BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  ::operator=(&(this->u).simpleVarSet,ptr);
  return;
}

Assistant:

void
JavascriptSet::PromoteToSimpleVarSet()
{
    AssertOrFailFast(this->kind == SetKind::IntSet);
    SimpleVarDataSet* newSet = this->CreateVarSetFromList<SimpleVarDataSet>(this->u.intSet->Count() + 1);

    this->kind = SetKind::SimpleVarSet;
    this->u.simpleVarSet = newSet;
}